

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
* __thiscall
kratos::GeneratorGraph::topological_sort
          (queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
           *__return_storage_ptr__,GeneratorGraph *this)

{
  GeneratorNode *node;
  long *plVar1;
  GeneratorNode *pGVar2;
  _Hash_node_base *p_Var3;
  unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
  *__range1;
  undefined1 local_60 [8];
  unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
  visited;
  
  local_60 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>::
  _M_initialize_map((_Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                     *)__return_storage_ptr__,0);
  p_Var3 = (this->nodes_)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      node = (GeneratorNode *)(p_Var3 + 2);
      if (*(long **)((long)local_60 + ((ulong)node % (ulong)visited._M_h._M_buckets) * 8) !=
          (long *)0x0) {
        plVar1 = (long *)**(long **)((long)local_60 +
                                    ((ulong)node % (ulong)visited._M_h._M_buckets) * 8);
        pGVar2 = (GeneratorNode *)plVar1[1];
        do {
          if (node == pGVar2) goto LAB_001b1a2c;
          plVar1 = (long *)*plVar1;
        } while ((plVar1 != (long *)0x0) &&
                (pGVar2 = (GeneratorNode *)plVar1[1],
                (ulong)pGVar2 % (ulong)visited._M_h._M_buckets ==
                (ulong)node % (ulong)visited._M_h._M_buckets));
      }
      topological_sort_helper
                (this,node,
                 (unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
                  *)local_60,__return_storage_ptr__);
LAB_001b1a2c:
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::queue<GeneratorNode *> GeneratorGraph::topological_sort() {
    std::unordered_set<GeneratorNode *> visited;
    std::queue<GeneratorNode *> queue;
    for (auto &iter : nodes_) {
        auto *node = &iter.second;
        if (visited.find(node) == visited.end()) {
            // visit it
            topological_sort_helper(this, node, visited, queue);
        }
    }
    return queue;
}